

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ip_voter.cpp
# Opt level: O0

bool __thiscall libtorrent::aux::ip_voter::maybe_rotate(ip_voter *this)

{
  ushort uVar1;
  bool bVar2;
  size_type sVar3;
  reference pvVar4;
  pointer peVar5;
  byte local_62;
  iterator iStack_60;
  bool ret;
  iterator i;
  __normal_iterator<libtorrent::aux::ip_voter::external_ip_t_*,_std::vector<libtorrent::aux::ip_voter::external_ip_t,_std::allocator<libtorrent::aux::ip_voter::external_ip_t>_>_>
  local_50;
  __normal_iterator<libtorrent::aux::ip_voter::external_ip_t_*,_std::vector<libtorrent::aux::ip_voter::external_ip_t,_std::allocator<libtorrent::aux::ip_voter::external_ip_t>_>_>
  local_48;
  __normal_iterator<libtorrent::aux::ip_voter::external_ip_t_*,_std::vector<libtorrent::aux::ip_voter::external_ip_t,_std::allocator<libtorrent::aux::ip_voter::external_ip_t>_>_>
  local_40;
  int local_34;
  duration<long,_std::ratio<60L,_1L>_> local_30;
  duration<long,_std::ratio<1L,_1000000000L>_> local_28;
  time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
  local_20;
  time_point now;
  ip_voter *this_local;
  
  now.__d.__r = (duration)(duration)this;
  local_20.__d.__r = (duration)time_now();
  local_62 = 0;
  if (this->m_total_votes < 0x32) {
    local_28.__r = (rep)::std::chrono::operator-(&local_20,&this->m_last_rotate);
    local_34 = 5;
    ::std::chrono::duration<long,std::ratio<60l,1l>>::duration<int,void>
              ((duration<long,std::ratio<60l,1l>> *)&local_30,&local_34);
    bVar2 = ::std::chrono::operator<(&local_28,&local_30);
    if ((bVar2) || (local_62 = 0, this->m_total_votes == 0)) {
      local_62 = this->m_valid_external;
    }
  }
  if ((local_62 & 1) == 0) {
    bVar2 = ::std::
            vector<libtorrent::aux::ip_voter::external_ip_t,_std::allocator<libtorrent::aux::ip_voter::external_ip_t>_>
            ::empty(&this->m_external_addresses);
    if (bVar2) {
      this_local._7_1_ = false;
    }
    else {
      sVar3 = ::std::
              vector<libtorrent::aux::ip_voter::external_ip_t,_std::allocator<libtorrent::aux::ip_voter::external_ip_t>_>
              ::size(&this->m_external_addresses);
      if (sVar3 == 1) {
        pvVar4 = ::std::
                 vector<libtorrent::aux::ip_voter::external_ip_t,_std::allocator<libtorrent::aux::ip_voter::external_ip_t>_>
                 ::operator[](&this->m_external_addresses,0);
        if (pvVar4->num_votes < 2) {
          return false;
        }
      }
      else {
        local_40._M_current =
             (external_ip_t *)
             ::std::
             vector<libtorrent::aux::ip_voter::external_ip_t,_std::allocator<libtorrent::aux::ip_voter::external_ip_t>_>
             ::begin(&this->m_external_addresses);
        local_50._M_current =
             (external_ip_t *)
             ::std::
             vector<libtorrent::aux::ip_voter::external_ip_t,_std::allocator<libtorrent::aux::ip_voter::external_ip_t>_>
             ::begin(&this->m_external_addresses);
        local_48 = __gnu_cxx::
                   __normal_iterator<libtorrent::aux::ip_voter::external_ip_t_*,_std::vector<libtorrent::aux::ip_voter::external_ip_t,_std::allocator<libtorrent::aux::ip_voter::external_ip_t>_>_>
                   ::operator+(&local_50,2);
        i = ::std::
            vector<libtorrent::aux::ip_voter::external_ip_t,_std::allocator<libtorrent::aux::ip_voter::external_ip_t>_>
            ::end(&this->m_external_addresses);
        ::std::
        partial_sort<__gnu_cxx::__normal_iterator<libtorrent::aux::ip_voter::external_ip_t*,std::vector<libtorrent::aux::ip_voter::external_ip_t,std::allocator<libtorrent::aux::ip_voter::external_ip_t>>>>
                  (local_40,local_48,
                   (__normal_iterator<libtorrent::aux::ip_voter::external_ip_t_*,_std::vector<libtorrent::aux::ip_voter::external_ip_t,_std::allocator<libtorrent::aux::ip_voter::external_ip_t>_>_>
                    )i._M_current);
        pvVar4 = ::std::
                 vector<libtorrent::aux::ip_voter::external_ip_t,_std::allocator<libtorrent::aux::ip_voter::external_ip_t>_>
                 ::operator[](&this->m_external_addresses,0);
        uVar1 = pvVar4->num_votes;
        pvVar4 = ::std::
                 vector<libtorrent::aux::ip_voter::external_ip_t,_std::allocator<libtorrent::aux::ip_voter::external_ip_t>_>
                 ::operator[](&this->m_external_addresses,1);
        if ((uint)(((ulong)uVar1 << 1) / 3) <= (uint)pvVar4->num_votes) {
          return false;
        }
      }
      iStack_60 = ::std::
                  vector<libtorrent::aux::ip_voter::external_ip_t,_std::allocator<libtorrent::aux::ip_voter::external_ip_t>_>
                  ::begin(&this->m_external_addresses);
      peVar5 = __gnu_cxx::
               __normal_iterator<libtorrent::aux::ip_voter::external_ip_t_*,_std::vector<libtorrent::aux::ip_voter::external_ip_t,_std::allocator<libtorrent::aux::ip_voter::external_ip_t>_>_>
               ::operator->(&stack0xffffffffffffffa0);
      this_local._7_1_ = boost::asio::ip::operator!=(&this->m_external_address,&peVar5->addr);
      peVar5 = __gnu_cxx::
               __normal_iterator<libtorrent::aux::ip_voter::external_ip_t_*,_std::vector<libtorrent::aux::ip_voter::external_ip_t,_std::allocator<libtorrent::aux::ip_voter::external_ip_t>_>_>
               ::operator->(&stack0xffffffffffffffa0);
      boost::asio::ip::address::operator=(&this->m_external_address,&peVar5->addr);
      bloom_filter<32>::clear(&this->m_external_address_voters);
      this->m_total_votes = 0;
      ::std::
      vector<libtorrent::aux::ip_voter::external_ip_t,_std::allocator<libtorrent::aux::ip_voter::external_ip_t>_>
      ::clear(&this->m_external_addresses);
      (this->m_last_rotate).__d.__r = (rep)local_20.__d.__r;
      this->m_valid_external = true;
    }
  }
  else {
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

bool ip_voter::maybe_rotate()
	{
		time_point now = aux::time_now();

		// if we have more than or equal to 50 votes,
		// we rotate. Also, if it's been more than 5 minutes
		// and we have at least one vote, we also rotate.
		// this is the inverse condition, since this is the case
		// were we exit, without rotating
		if (m_total_votes < 50
			&& (now - m_last_rotate < minutes(5) || m_total_votes == 0)
			&& m_valid_external)
			return false;

		// this shouldn't really happen if we have at least one
		// vote.
		if (m_external_addresses.empty()) return false;

		// if there's just one vote, go with that
		if (m_external_addresses.size() == 1)
		{
			// avoid flapping. We need more votes to change our mind on the
			// external IP
			if (m_external_addresses[0].num_votes < 2) return false;
		}
		else
		{
			// find the top two votes.
			std::partial_sort(m_external_addresses.begin()
				, m_external_addresses.begin() + 2, m_external_addresses.end());

			// if we don't have enough of a majority voting for the winning
			// IP, don't rotate. This avoids flapping
			if (m_external_addresses[0].num_votes * 2 / 3 <= m_external_addresses[1].num_votes)
				return false;
		}

		auto const i = m_external_addresses.begin();

		bool ret = m_external_address != i->addr;
		m_external_address = i->addr;

		m_external_address_voters.clear();
		m_total_votes = 0;
		m_external_addresses.clear();
		m_last_rotate = now;
		m_valid_external = true;
		return ret;
	}